

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttmtx.c
# Opt level: O0

FT_Error tt_face_load_hmtx(TT_Face face,FT_Stream stream,FT_Bool vertical)

{
  FT_ULong FVar1;
  FT_ULong *local_40;
  FT_ULong *ptable_size;
  FT_ULong *ptable_offset;
  FT_ULong table_size;
  FT_ULong tag;
  FT_Error error;
  FT_Bool vertical_local;
  FT_Stream stream_local;
  TT_Face face_local;
  
  if (vertical == '\0') {
    table_size = 0x686d7478;
    ptable_size = &face->horz_metrics_offset;
    local_40 = &face->horz_metrics_size;
  }
  else {
    table_size = 0x766d7478;
    ptable_size = &face->vert_metrics_offset;
    local_40 = &face->vert_metrics_size;
  }
  tag._7_1_ = vertical;
  _error = stream;
  stream_local = (FT_Stream)face;
  tag._0_4_ = (*face->goto_table)(face,table_size,stream,(FT_ULong *)&ptable_offset);
  if ((FT_Error)tag == 0) {
    *local_40 = (FT_ULong)ptable_offset;
    FVar1 = FT_Stream_Pos(_error);
    *ptable_size = FVar1;
  }
  return (FT_Error)tag;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_hmtx( TT_Face    face,
                     FT_Stream  stream,
                     FT_Bool    vertical )
  {
    FT_Error   error;
    FT_ULong   tag, table_size;
    FT_ULong*  ptable_offset;
    FT_ULong*  ptable_size;


    if ( vertical )
    {
      tag           = TTAG_vmtx;
      ptable_offset = &face->vert_metrics_offset;
      ptable_size   = &face->vert_metrics_size;
    }
    else
    {
      tag           = TTAG_hmtx;
      ptable_offset = &face->horz_metrics_offset;
      ptable_size   = &face->horz_metrics_size;
    }

    error = face->goto_table( face, tag, stream, &table_size );
    if ( error )
      goto Fail;

    *ptable_size   = table_size;
    *ptable_offset = FT_STREAM_POS();

  Fail:
    return error;
  }